

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

Nonnull<char_*> absl::numbers_internal::FastIntToBuffer(int32_t i,Nonnull<char_*> buffer)

{
  ulong uVar1;
  uint64_t uVar2;
  long *plVar3;
  
  if (i < 0) {
    *buffer = '-';
    buffer = buffer + 1;
    i = -i;
  }
  if ((uint)i < 10) {
    *buffer = (byte)i | 0x30;
    plVar3 = (long *)((long)buffer + 1);
  }
  else {
    if ((uint)i < 100000000) {
      uVar2 = anon_unknown_0::PrepareEightDigits(i);
      if (uVar2 == 0) {
        __assert_fail("bottom != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                      ,0xf4,
                      "absl::Nonnull<char *> absl::(anonymous namespace)::EncodeFullU32(uint32_t, absl::Nonnull<char *>)"
                     );
      }
      uVar1 = 0;
      if (uVar2 != 0) {
        for (; (uVar2 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      *(uint64_t *)buffer = uVar2 + 0x3030303030303030 >> ((byte)uVar1 & 0x38);
      plVar3 = (long *)((long)buffer - (uVar1 >> 3 & 0x1fffffff));
    }
    else {
      uVar2 = anon_unknown_0::PrepareEightDigits((uint)i % 100000000);
      plVar3 = (long *)anon_unknown_0::EncodeHundred((uint)i / 100000000,buffer);
      *plVar3 = uVar2 + 0x3030303030303030;
    }
    plVar3 = plVar3 + 1;
  }
  *(char *)plVar3 = '\0';
  return (Nonnull<char_*>)plVar3;
}

Assistant:

absl::Nonnull<char*> numbers_internal::FastIntToBuffer(
    int32_t i, absl::Nonnull<char*> buffer) {
  uint32_t u = static_cast<uint32_t>(i);
  if (i < 0) {
    *buffer++ = '-';
    // We need to do the negation in modular (i.e., "unsigned")
    // arithmetic; MSVC++ apparently warns for plain "-u", so
    // we write the equivalent expression "0 - u" instead.
    u = 0 - u;
  }
  buffer = EncodeFullU32(u, buffer);
  *buffer = '\0';
  return buffer;
}